

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataCommon.cpp
# Opt level: O2

void DATA_CONVERSION::ConvertSamplesToUniformSpikeTrains
               (vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                *samples,
               vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
               *spikeTrains,float inputSimulationTime,float minRate,float maxRate)

{
  float *pfVar1;
  pointer pvVar2;
  int sampleId;
  size_type sVar3;
  int iVar4;
  pointer pvVar5;
  size_type sVar6;
  int activationId_1;
  size_type sVar7;
  size_type __new_size;
  long lVar8;
  int idx;
  int iVar9;
  ulong uVar10;
  float fVar11;
  float fVar12;
  value_type_conflict1 local_98;
  allocator_type local_91;
  float local_90;
  float local_8c;
  float local_88;
  float local_84;
  vector<float,_std::allocator<float>_> maxValues;
  vector<float,_std::allocator<float>_> minValues;
  
  pvVar2 = (samples->
           super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (pvVar2 != (samples->
                super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
    maxValues.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start._0_4_ = 0;
    local_90 = minRate;
    local_8c = inputSimulationTime;
    std::vector<float,_std::allocator<float>_>::vector
              (&minValues,
               (long)(pvVar2->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(pvVar2->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                     super__Vector_impl_data._M_start >> 2,(value_type_conflict1 *)&maxValues,
               (allocator_type *)&local_98);
    pvVar2 = (samples->
             super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    local_98 = 0.0;
    std::vector<float,_std::allocator<float>_>::vector
              (&maxValues,
               (long)*(pointer *)
                      ((long)&(pvVar2->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                              super__Vector_impl_data + 8) -
               *(long *)&(pvVar2->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                         super__Vector_impl_data >> 2,&local_98,&local_91);
    pvVar2 = (samples->
             super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    lVar8 = *(long *)&(pvVar2->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                      super__Vector_impl_data;
    __new_size = (long)*(pointer *)
                        ((long)&(pvVar2->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                                super__Vector_impl_data + 8) - lVar8 >> 2;
    for (sVar6 = 0; __new_size != sVar6; sVar6 = sVar6 + 1) {
      fVar11 = *(float *)(lVar8 + sVar6 * 4);
      minValues.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start[sVar6] = fVar11;
      *(float *)(CONCAT44(maxValues.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start._4_4_,
                          maxValues.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start._0_4_) + sVar6 * 4) = fVar11;
    }
    sVar6 = ((long)(samples->
                   super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar2) / 0x18;
    for (sVar3 = 0; sVar3 != sVar6; sVar3 = sVar3 + 1) {
      for (sVar7 = 0; __new_size != sVar7; sVar7 = sVar7 + 1) {
        lVar8 = *(long *)&pvVar2[sVar3].super__Vector_base<float,_std::allocator<float>_>._M_impl;
        fVar11 = *(float *)(lVar8 + sVar7 * 4);
        if (fVar11 < minValues.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start[sVar7]) {
          minValues.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start[sVar7] = fVar11;
          fVar11 = *(float *)(lVar8 + sVar7 * 4);
        }
        pfVar1 = (float *)(CONCAT44(maxValues.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_start._4_4_,
                                    maxValues.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_start._0_4_) + sVar7 * 4);
        if (*pfVar1 <= fVar11 && fVar11 != *pfVar1) {
          *(float *)(CONCAT44(maxValues.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start._4_4_,
                              maxValues.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start._0_4_) + sVar7 * 4) = fVar11;
        }
      }
    }
    std::
    vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
    ::resize(spikeTrains,sVar6);
    lVar8 = 0;
    uVar10 = 0;
    while( true ) {
      pvVar2 = (samples->
               super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pvVar5 = (samples->
               super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      if ((ulong)(((long)pvVar5 - (long)pvVar2) / 0x18) <= uVar10) break;
      std::
      vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ::resize((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                *)(*(long *)spikeTrains + lVar8),__new_size);
      uVar10 = uVar10 + 1;
      lVar8 = lVar8 + 0x18;
    }
    fVar11 = maxRate - local_90;
    for (sVar6 = 0; sVar6 != __new_size; sVar6 = sVar6 + 1) {
      local_88 = *(float *)(CONCAT44(maxValues.super__Vector_base<float,_std::allocator<float>_>.
                                     _M_impl.super__Vector_impl_data._M_start._4_4_,
                                     maxValues.super__Vector_base<float,_std::allocator<float>_>.
                                     _M_impl.super__Vector_impl_data._M_start._0_4_) + sVar6 * 4) -
                 minValues.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start[sVar6];
      for (uVar10 = 0; uVar10 < (ulong)(((long)pvVar5 - (long)pvVar2) / 0x18); uVar10 = uVar10 + 1)
      {
        fVar12 = (((*(float *)(*(long *)&pvVar2[uVar10].
                                         super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                         super__Vector_impl_data + sVar6 * 4) -
                   minValues.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start[sVar6]) / local_88) * fVar11 + local_90) *
                 local_8c;
        iVar4 = (int)fVar12;
        local_84 = local_8c / (float)(int)fVar12;
        iVar9 = 0;
        if (iVar4 < 1) {
          iVar4 = iVar9;
        }
        for (; iVar4 != iVar9; iVar9 = iVar9 + 1) {
          local_98 = (float)iVar9 * local_84;
          std::vector<float,_std::allocator<float>_>::emplace_back<float>
                    ((vector<float,_std::allocator<float>_> *)
                     (*(long *)(*(long *)spikeTrains + uVar10 * 0x18) + sVar6 * 0x18),&local_98);
        }
        pvVar2 = (samples->
                 super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        pvVar5 = (samples->
                 super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      }
    }
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              (&maxValues.super__Vector_base<float,_std::allocator<float>_>);
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              (&minValues.super__Vector_base<float,_std::allocator<float>_>);
  }
  return;
}

Assistant:

void DATA_CONVERSION::ConvertSamplesToUniformSpikeTrains(
        std::vector<SPIKING_NN::Sample> &samples,
        std::vector<SPIKING_NN::SpikeTrain> &spikeTrains,
        float inputSimulationTime,
        float minRate, float maxRate )
{
    if ( samples.empty()) {
        return;
    }

    std::vector<float> minValues( samples[0].size(), 0 );
    std::vector<float> maxValues( samples[0].size(), 0 );
    for ( auto activationId = 0; activationId < samples[0].size(); ++activationId ) {
        minValues[activationId] = samples[0][activationId];
        maxValues[activationId] = samples[0][activationId];
    }

    for ( auto sampleId = 0; sampleId < samples.size(); ++sampleId ) {
        for ( auto activationId = 0; activationId < samples[0].size(); ++activationId ) {
            if ( samples[sampleId][activationId] < minValues[activationId] ) {
                minValues[activationId] = samples[sampleId][activationId];
            }
            if ( samples[sampleId][activationId] > maxValues[activationId] ) {
                maxValues[activationId] = samples[sampleId][activationId];
            }
        }
    }

    // We are not checking maxValues[idx] == minValues[idx] because such params are redundant in dataset
    std::uniform_real_distribution<float> distribution( 0, 1 );
    std::uniform_real_distribution<float> timeNoiseDistribution( 0, SPIKING_NN::TIME_STEP / 1e4f );
    size_t inputSize = samples[0].size();
    spikeTrains.resize( samples.size());
    for ( int idx = 0; idx < samples.size(); ++idx ) {
        spikeTrains[idx].resize( inputSize );
    }
    for ( auto activationId = 0; activationId < inputSize; ++activationId ) {
        float maxDelta = ( maxValues[activationId] - minValues[activationId] );
        for ( int sid = 0; sid < samples.size(); ++sid ) {
            float &activation = samples[sid][activationId];
            float intensity = ( activation - minValues[activationId] ) / maxDelta;
            int numSpikes = static_cast<int>(inputSimulationTime * ( intensity * ( maxRate - minRate ) + minRate ));
            float spikeStep = inputSimulationTime / numSpikes;
            for ( int tdx = 0; tdx < numSpikes; ++tdx ) {
                spikeTrains[sid][activationId].emplace_back( tdx * spikeStep );
            }
        }
    }
}